

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# program_options.cpp
# Opt level: O1

OptionContext * __thiscall
Potassco::ProgramOptions::OptionContext::addAlias
          (OptionContext *this,string *aliasName,option_iterator option)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pointer pIVar2;
  pointer pcVar3;
  DuplicateOption *this_00;
  pair<std::_Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>,_bool>
  pVar4;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>
  local_58;
  
  if (((this->options_).
       super__Vector_base<Potassco::ProgramOptions::detail::IntrusiveSharedPtr<Potassco::ProgramOptions::Option>,_std::allocator<Potassco::ProgramOptions::detail::IntrusiveSharedPtr<Potassco::ProgramOptions::Option>_>_>
       ._M_impl.super__Vector_impl_data._M_finish != option._M_current) &&
     (aliasName->_M_string_length != 0)) {
    pIVar2 = (this->options_).
             super__Vector_base<Potassco::ProgramOptions::detail::IntrusiveSharedPtr<Potassco::ProgramOptions::Option>,_std::allocator<Potassco::ProgramOptions::detail::IntrusiveSharedPtr<Potassco::ProgramOptions::Option>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    paVar1 = &local_58.first.field_2;
    pcVar3 = (aliasName->_M_dataplus)._M_p;
    local_58.first._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_58,pcVar3,pcVar3 + aliasName->_M_string_length);
    local_58.second = (long)option._M_current - (long)pIVar2 >> 3;
    pVar4 = std::
            _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,unsigned_long>,std::_Select1st<std::pair<std::__cxx11::string_const,unsigned_long>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,unsigned_long>>>
            ::_M_insert_unique<std::pair<std::__cxx11::string_const,unsigned_long>>
                      ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,unsigned_long>,std::_Select1st<std::pair<std::__cxx11::string_const,unsigned_long>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,unsigned_long>>>
                        *)this,&local_58);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_58.first._M_dataplus._M_p != paVar1) {
      operator_delete(local_58.first._M_dataplus._M_p);
    }
    if (((undefined1  [16])pVar4 & (undefined1  [16])0x1) == (undefined1  [16])0x0) {
      this_00 = (DuplicateOption *)__cxa_allocate_exception(0x58);
      DuplicateOption::DuplicateOption(this_00,&this->caption_,aliasName);
      __cxa_throw(this_00,&DuplicateOption::typeinfo,ContextError::~ContextError);
    }
  }
  return this;
}

Assistant:

OptionContext& OptionContext::addAlias(const std::string& aliasName, option_iterator option) {
	if (option != end() && !aliasName.empty()) {
		key_type k(option - begin());
		if (!index_.insert(Name2Key::value_type(aliasName, k)).second) { throw DuplicateOption(caption(), aliasName); }
	}
	return *this;
}